

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O2

void av1_update_rd_thresh_fact
               (AV1_COMMON *cm,int (*factor_buf) [169],int use_adaptive_rd_thresh,BLOCK_SIZE bsize,
               THR_MODES best_mode_index,THR_MODES inter_mode_start,THR_MODES inter_mode_end,
               THR_MODES intra_mode_start,THR_MODES intra_mode_end)

{
  BLOCK_SIZE BVar1;
  BLOCK_SIZE BVar2;
  BLOCK_SIZE max_size;
  uint uVar3;
  
  BVar1 = cm->seq_params->sb_size;
  max_size = bsize;
  if (bsize <= BVar1) {
    BVar2 = BLOCK_8X4;
    if (BLOCK_8X4 < bsize) {
      BVar2 = bsize;
    }
    uVar3 = (uint)bsize;
    bsize = BVar2 - BLOCK_8X4;
    max_size = (BLOCK_SIZE)(uVar3 + 2);
    if ((uint)BVar1 <= uVar3 + 2) {
      max_size = BVar1;
    }
  }
  update_thr_fact(factor_buf,best_mode_index,inter_mode_start,inter_mode_end,bsize,max_size,
                  use_adaptive_rd_thresh << 6);
  update_thr_fact(factor_buf,best_mode_index,intra_mode_start,intra_mode_end,bsize,max_size,
                  use_adaptive_rd_thresh << 6);
  return;
}

Assistant:

void av1_update_rd_thresh_fact(
    const AV1_COMMON *const cm, int (*factor_buf)[MAX_MODES],
    int use_adaptive_rd_thresh, BLOCK_SIZE bsize, THR_MODES best_mode_index,
    THR_MODES inter_mode_start, THR_MODES inter_mode_end,
    THR_MODES intra_mode_start, THR_MODES intra_mode_end) {
  assert(use_adaptive_rd_thresh > 0);
  const int max_rd_thresh_factor = use_adaptive_rd_thresh * RD_THRESH_MAX_FACT;

  const int bsize_is_1_to_4 = bsize > cm->seq_params->sb_size;
  BLOCK_SIZE min_size, max_size;
  if (bsize_is_1_to_4) {
    // This part handles block sizes with 1:4 and 4:1 aspect ratios
    // TODO(any): Experiment with threshold update for parent/child blocks
    min_size = bsize;
    max_size = bsize;
  } else {
    min_size = AOMMAX(bsize - 2, BLOCK_4X4);
    max_size = AOMMIN(bsize + 2, (int)cm->seq_params->sb_size);
  }

  update_thr_fact(factor_buf, best_mode_index, inter_mode_start, inter_mode_end,
                  min_size, max_size, max_rd_thresh_factor);
  update_thr_fact(factor_buf, best_mode_index, intra_mode_start, intra_mode_end,
                  min_size, max_size, max_rd_thresh_factor);
}